

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O2

void duckdb::roaring::RoaringCompressState::HandleNoneValid
               (RoaringCompressState *state,idx_t amount)

{
  uint16_t amount_00;
  uint16_t uVar1;
  
  amount_00 = (state->container_state).length;
  if (amount_00 == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = amount_00;
    if ((state->container_state).last_bit_set == true) {
      uVar1 = 0;
      ContainerCompressionState::Append(&state->container_state,false,amount_00);
    }
  }
  (state->container_state).length = uVar1 + (short)amount;
  (state->container_state).last_bit_set = false;
  return;
}

Assistant:

void RoaringCompressState::HandleNoneValid(RoaringCompressState &state, idx_t amount) {
	auto &container_state = state.container_state;
	if (container_state.length && container_state.last_bit_set == true) {
		container_state.Append(!container_state.last_bit_set, container_state.length);
		container_state.length = 0;
	}
	container_state.length += amount;
	container_state.last_bit_set = false;
}